

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::applyFilter
          (UnicodeSet *this,Filter filter,void *context,UnicodeSet *inclusions,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 UVar3;
  int local_48;
  UChar32 ch;
  UChar32 end;
  UChar32 start;
  int j;
  int32_t limitRange;
  UChar32 startHasProperty;
  UErrorCode *status_local;
  UnicodeSet *inclusions_local;
  void *context_local;
  Filter filter_local;
  UnicodeSet *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    clear(this);
    j = -1;
    iVar2 = getRangeCount(inclusions);
    for (end = 0; end < iVar2; end = end + 1) {
      local_48 = getRangeStart(inclusions,end);
      UVar3 = getRangeEnd(inclusions,end);
      for (; local_48 <= UVar3; local_48 = local_48 + 1) {
        UVar1 = (*filter)(local_48,context);
        if (UVar1 == '\0') {
          if (-1 < j) {
            add(this,j,local_48 + -1);
            j = -1;
          }
        }
        else if (j < 0) {
          j = local_48;
        }
      }
    }
    if (-1 < j) {
      add(this,j,0x10ffff);
    }
    UVar1 = isBogus(this);
    if ((UVar1 != '\0') && (UVar1 = ::U_SUCCESS(*status), UVar1 != '\0')) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

void UnicodeSet::applyFilter(UnicodeSet::Filter filter,
                             void* context,
                             const UnicodeSet* inclusions,
                             UErrorCode &status) {
    if (U_FAILURE(status)) return;

    // Logically, walk through all Unicode characters, noting the start
    // and end of each range for which filter.contain(c) is
    // true.  Add each range to a set.
    //
    // To improve performance, use an inclusions set which
    // encodes information about character ranges that are known
    // to have identical properties.
    // inclusions contains the first characters of
    // same-value ranges for the given property.

    clear();

    UChar32 startHasProperty = -1;
    int32_t limitRange = inclusions->getRangeCount();

    for (int j=0; j<limitRange; ++j) {
        // get current range
        UChar32 start = inclusions->getRangeStart(j);
        UChar32 end = inclusions->getRangeEnd(j);

        // for all the code points in the range, process
        for (UChar32 ch = start; ch <= end; ++ch) {
            // only add to this UnicodeSet on inflection points --
            // where the hasProperty value changes to false
            if ((*filter)(ch, context)) {
                if (startHasProperty < 0) {
                    startHasProperty = ch;
                }
            } else if (startHasProperty >= 0) {
                add(startHasProperty, ch-1);
                startHasProperty = -1;
            }
        }
    }
    if (startHasProperty >= 0) {
        add((UChar32)startHasProperty, (UChar32)0x10FFFF);
    }
    if (isBogus() && U_SUCCESS(status)) {
        // We likely ran out of memory. AHHH!
        status = U_MEMORY_ALLOCATION_ERROR;
    }
}